

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

float * drwav__read_and_close_f32
                  (drwav *pWav,uint *channels,uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  float *pBufferOut;
  drwav_uint64 dVar1;
  
  dVar1 = pWav->totalSampleCount;
  pBufferOut = (float *)malloc(dVar1 * 4);
  if (pBufferOut != (float *)0x0) {
    dVar1 = drwav_read_f32(pWav,dVar1,pBufferOut);
    if (dVar1 == pWav->totalSampleCount) {
      drwav_uninit(pWav);
      if (sampleRate != (uint *)0x0) {
        *sampleRate = pWav->sampleRate;
      }
      if (channels != (uint *)0x0) {
        *channels = (uint)pWav->channels;
      }
      if (totalSampleCount == (drwav_uint64 *)0x0) {
        return pBufferOut;
      }
      *totalSampleCount = pWav->totalSampleCount;
      return pBufferOut;
    }
    free(pBufferOut);
  }
  drwav_uninit(pWav);
  return (float *)0x0;
}

Assistant:

float* drwav__read_and_close_f32(drwav* pWav, unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount)
{
    drwav_assert(pWav != NULL);

    drwav_uint64 sampleDataSize = pWav->totalSampleCount * sizeof(float);
    if (sampleDataSize > DRWAV_SIZE_MAX) {
        drwav_uninit(pWav);
        return NULL;    // File's too big.
    }

    float* pSampleData = (float*)DRWAV_MALLOC((size_t)sampleDataSize);    // <-- Safe cast due to the check above.
    if (pSampleData == NULL) {
        drwav_uninit(pWav);
        return NULL;    // Failed to allocate memory.
    }

    drwav_uint64 samplesRead = drwav_read_f32(pWav, (size_t)pWav->totalSampleCount, pSampleData);
    if (samplesRead != pWav->totalSampleCount) {
        DRWAV_FREE(pSampleData);
        drwav_uninit(pWav);
        return NULL;    // There was an error reading the samples.
    }

    drwav_uninit(pWav);

    if (sampleRate) *sampleRate = pWav->sampleRate;
    if (channels) *channels = pWav->channels;
    if (totalSampleCount) *totalSampleCount = pWav->totalSampleCount;
    return pSampleData;
}